

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

float * __thiscall
google::protobuf::internal::UntypedMapBase::GetValue<float>(UntypedMapBase *this,NodeBase *node)

{
  Nonnull<const_char_*> pcVar1;
  uint uVar2;
  
  uVar2 = (uint)((byte)(this->type_info_).field_0x3 >> 4);
  if (uVar2 == 3) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (3,(ulong)uVar2,
                        "static_cast<int>(StaticTypeKind<T>()) == static_cast<int>(type_info_.value_type)"
                       );
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return (float *)((long)&node->next + (ulong)(this->type_info_).value_offset);
  }
  GetValue<float>();
}

Assistant:

T* GetValue(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.value_type));
    return reinterpret_cast<T*>(GetVoidValue(node));
  }